

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

int fy_node_set_meta(fy_node *fyn,void *meta)

{
  fy_document *pfVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((fyn != (fy_node *)0x0) && (pfVar1 = fyn->fyd, iVar2 = -1, pfVar1 != (fy_document *)0x0)) {
    if (((fyn->field_0x34 & 4) != 0) && (pfVar1->meta_clear_fn != (fy_node_meta_clear_fn)0x0)) {
      (*pfVar1->meta_clear_fn)(fyn,fyn->meta,pfVar1->meta_user);
    }
    fyn->meta = meta;
    fyn->field_0x34 = fyn->field_0x34 | 4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int fy_node_set_meta(struct fy_node *fyn, void *meta) {
    struct fy_document *fyd;

    if (!fyn || !fyn->fyd)
        return -1;

    fyd = fyn->fyd;
    if (fyn->has_meta && fyd->meta_clear_fn)
        fyd->meta_clear_fn(fyn, fyn->meta, fyd->meta_user);
    fyn->meta = meta;
    fyn->has_meta = true;

    return 0;
}